

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

LO Omega_h::find_last<signed_char>(Read<signed_char> *array,char value)

{
  int iVar1;
  undefined1 local_80 [8];
  type transform;
  maximum<int> op;
  int init;
  IntIterator last;
  IntIterator first;
  char value_local;
  Read<signed_char> *array_local;
  undefined4 local_10;
  
  if (((ulong)(array->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (undefined4)((array->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (undefined4)((ulong)(array->write_).shared_alloc_.alloc >> 3);
  }
  transform._23_1_ = 0;
  Read<signed_char>::Read((Read<signed_char> *)local_80,array);
  transform.array.write_.shared_alloc_.direct_ptr._0_1_ = value;
  iVar1 = transform_reduce<Omega_h::IntIterator,Omega_h::find_last<signed_char>(Omega_h::Read<signed_char>,signed_char)::_lambda(int)_1_,int,Omega_h::maximum<int>>
                    (0,local_10,0xffffffff,(Read<signed_char> *)local_80);
  find_last<signed_char>(Omega_h::Read<signed_char>,signed_char)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_80);
  return iVar1;
}

Assistant:

LO find_last(Read<T> array, T value) {
  auto const first = IntIterator(0);
  auto const last = IntIterator(array.size());
  auto const init = -1;
  auto const op = maximum<LO>();
  auto transform = OMEGA_H_LAMBDA(LO i)->LO {
    if (array[i] == value)
      return i;
    else
      return -1;
  };
  return transform_reduce(first, last, init, op, std::move(transform));
}